

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
string_split<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *str,char delim)

{
  istream *piVar1;
  int value;
  string token;
  istringstream str_stream;
  istringstream token_stream;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&str_stream,(string *)str,_S_in);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&str_stream,(string *)&token,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&token_stream,(string *)&token,_S_in);
    std::istream::operator>>((istream *)&token_stream,&value);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&value);
    std::__cxx11::istringstream::~istringstream((istringstream *)&token_stream);
  }
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::istringstream::~istringstream((istringstream *)&str_stream);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> string_split(const std::string & str, char delim) {
    static_assert(!std::is_same<T, std::string>::value, "Please use the specialized version for std::string");
    std::vector<T> values;
    std::istringstream str_stream(str);
    std::string token;
    while (std::getline(str_stream, token, delim)) {
        T value;
        std::istringstream token_stream(token);
        token_stream >> value;
        values.push_back(value);
    }
    return values;
}